

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

float stbtt__oversample_shift(int oversample)

{
  int oversample_local;
  undefined4 local_4;
  
  if (oversample == 0) {
    local_4 = 0.0;
  }
  else {
    local_4 = (float)-(oversample + -1) / ((float)oversample * 2.0);
  }
  return local_4;
}

Assistant:

static float stbtt__oversample_shift(int oversample)
{
   if (!oversample)
      return 0.0f;

   // The prefilter is a box filter of width "oversample",
   // which shifts phase by (oversample - 1)/2 pixels in
   // oversampled space. We want to shift in the opposite
   // direction to counter this.
   return (float)-(oversample - 1) / (2.0f * (float)oversample);
}